

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash_longest_match_inc.h
# Opt level: O2

void InitializeH5(HasherHandle handle,BrotliEncoderParams *params)

{
  long lVar1;
  
  *(int *)(handle + 0x38) = 0x20 - *(int *)(handle + 4);
  *(long *)(handle + 0x28) = 1L << ((byte)*(int *)(handle + 4) & 0x3f);
  lVar1 = 1L << (handle[8] & 0x3f);
  *(long *)(handle + 0x30) = lVar1;
  *(int *)(handle + 0x3c) = (int)lVar1 + -1;
  return;
}

Assistant:

static void FN(Initialize)(
    HasherHandle handle, const BrotliEncoderParams* params) {
  HasherCommon* common = GetHasherCommon(handle);
  HashLongestMatch* self = FN(Self)(handle);
  BROTLI_UNUSED(params);
  self->hash_shift_ = 32 - common->params.bucket_bits;
  self->bucket_size_ = (size_t)1 << common->params.bucket_bits;
  self->block_size_ = (size_t)1 << common->params.block_bits;
  self->block_mask_ = (uint32_t)(self->block_size_ - 1);
}